

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testOptimizedInterleavePatterns.cpp
# Opt level: O2

void anon_unknown.dwarf_2273d4::runtests(bool nonfatal,bool tiny)

{
  int banks;
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  char **channels;
  char **passivechannels;
  PixelType *pt;
  char **channels_00;
  PixelType *pt_00;
  char cVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  ostream *poVar8;
  int *piVar9;
  long lVar10;
  undefined4 *puVar11;
  _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
  *this;
  Vec2<int> *pVVar12;
  Header *hdr_00;
  undefined1 nonfatal_00;
  char **passivechannels_00;
  long lVar13;
  long lVar14;
  undefined8 *puVar15;
  allocator<char> local_339;
  InputFile infile;
  FrameBuffer preReadFrameBuf;
  FrameBuffer readFrameBuf;
  FrameBuffer writeFrameBuf;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_228;
  size_type *local_208;
  undefined8 local_200;
  Box2i local_1f8;
  Header hdr;
  ostringstream q;
  
  random_reseed(1);
  (anonymous_namespace)::gSuccesses = 0;
  (anonymous_namespace)::gOptimisedReads = 0;
  for (lVar14 = 0; lVar14 != 0x23; lVar14 = lVar14 + 1) {
    pcVar1 = (&(anonymous_namespace)::Schemes)[lVar14 * 6];
    for (lVar13 = 0; lVar10 = std::cout, lVar13 != 0x23; lVar13 = lVar13 + 1) {
      pcVar2 = (&(anonymous_namespace)::Schemes)[lVar13 * 6];
      *(uint *)(&Imf_3_2::TypedAttribute<int>::typeinfo + *(long *)(std::cout + -0x18)) =
           *(uint *)(&Imf_3_2::TypedAttribute<int>::typeinfo + *(long *)(std::cout + -0x18)) &
           0xffffff4f | 0x80;
      *(undefined8 *)(IlmThread_3_2::ThreadPool::ThreadPool + *(long *)(lVar10 + -0x18)) = 2;
      poVar8 = (ostream *)std::ostream::operator<<(&std::cout,(int)lVar14);
      poVar8 = std::operator<<(poVar8,',');
      lVar10 = *(long *)poVar8;
      lVar3 = *(long *)(lVar10 + -0x18);
      *(uint *)(poVar8 + lVar3 + 0x18) = *(uint *)(poVar8 + lVar3 + 0x18) & 0xffffff4f | 0x80;
      *(undefined8 *)(poVar8 + *(long *)(lVar10 + -0x18) + 0x10) = 2;
      poVar8 = (ostream *)std::ostream::operator<<(poVar8,(int)lVar13);
      std::operator<<(poVar8,": ");
      std::ostream::flush();
      channels = (char **)(&PTR_rgb_001d4448)[lVar14 * 6];
      passivechannels = (char **)(&DAT_001d4450)[lVar14 * 6];
      iVar7 = (&DAT_001d4458)[lVar14 * 0xc];
      puVar15 = (undefined8 *)(&DAT_001d4460)[lVar14 * 6];
      pt = (PixelType *)(&DAT_001d4468)[lVar14 * 6];
      channels_00 = (char **)(&PTR_rgb_001d4448)[lVar13 * 6];
      passivechannels_00 = (char **)(&DAT_001d4450)[lVar13 * 6];
      banks = (&DAT_001d4458)[lVar13 * 0xc];
      pt_00 = (PixelType *)(&DAT_001d4468)[lVar13 * 6];
      std::__cxx11::ostringstream::ostringstream((ostringstream *)&q);
      poVar8 = std::operator<<((ostream *)&q,pcVar1);
      poVar8 = std::operator<<(poVar8," read as ");
      poVar8 = std::operator<<(poVar8,pcVar2);
      std::operator<<(poVar8,"...");
      lVar10 = std::cout;
      *(uint *)(&Imf_3_2::TypedAttribute<int>::typeinfo + *(long *)(std::cout + -0x18)) =
           *(uint *)(&Imf_3_2::TypedAttribute<int>::typeinfo + *(long *)(std::cout + -0x18)) &
           0xffffff4f | 0x20;
      *(undefined8 *)(IlmThread_3_2::ThreadPool::ThreadPool + *(long *)(lVar10 + -0x18)) = 0x35;
      std::__cxx11::stringbuf::str();
      std::operator<<((ostream *)&std::cout,(string *)&hdr);
      std::__cxx11::string::~string((string *)&hdr);
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      readFrameBuf._map._M_t._M_impl._0_8_ = 0;
      writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           writeFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      Imf_3_2::Header::Header
                (&hdr,0x80,0x80,1.0,(Vec2 *)&readFrameBuf,1.0,INCREASING_Y,ZIP_COMPRESSION);
      iVar5 = random_int(0xc9);
      piVar9 = (int *)Imf_3_2::Header::dataWindow();
      *piVar9 = iVar5 + -100;
      iVar5 = random_int(0xc9);
      lVar10 = Imf_3_2::Header::dataWindow();
      *(int *)(lVar10 + 4) = iVar5 + -100;
      if (nonfatal) {
        piVar9 = (int *)Imf_3_2::Header::dataWindow();
        iVar5 = *piVar9;
        iVar6 = random_int(0xe);
        lVar10 = Imf_3_2::Header::dataWindow();
        *(int *)(lVar10 + 8) = iVar5 + iVar6 + 1;
        lVar10 = Imf_3_2::Header::dataWindow();
        iVar5 = *(int *)(lVar10 + 4);
        iVar6 = random_int(0xe);
        lVar10 = Imf_3_2::Header::dataWindow();
        iVar5 = iVar5 + iVar6 + 1;
      }
      else {
        piVar9 = (int *)Imf_3_2::Header::dataWindow();
        iVar5 = *piVar9;
        iVar6 = random_int(400);
        lVar10 = Imf_3_2::Header::dataWindow();
        *(int *)(lVar10 + 8) = iVar5 + iVar6 + 0x40;
        lVar10 = Imf_3_2::Header::dataWindow();
        iVar5 = *(int *)(lVar10 + 4);
        iVar6 = random_int(400);
        lVar10 = Imf_3_2::Header::dataWindow();
        iVar5 = iVar5 + iVar6 + 0x40;
      }
      *(int *)(lVar10 + 0xc) = iVar5;
      puVar11 = (undefined4 *)Imf_3_2::Header::compression();
      *puVar11 = 2;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      setupBuffer((ChannelList *)&local_228,&hdr,channels,passivechannels,pt,&writeFrameBuf,
                  &readFrameBuf,&preReadFrameBuf,iVar7,true);
      this = (_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
              *)Imf_3_2::Header::channels();
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
      ::operator=(this,(_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                        *)&local_228);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                   *)&local_228);
      if (puVar15 != (undefined8 *)0x0) {
        _infile = 0;
        for (; (char *)*puVar15 != (char *)0x0; puVar15 = puVar15 + 1) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_228,(char *)*puVar15,&local_339);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&infile,
                     &local_228);
          std::__cxx11::string::~string((string *)&local_228);
        }
        Imf_3_2::addMultiView(&hdr,(vector *)&infile);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&infile);
      }
      remove((anonymous_namespace)::filename_abi_cxx11_);
      pcVar2 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar7 = Imf_3_2::globalThreadCount();
      Imf_3_2::OutputFile::OutputFile((OutputFile *)&local_228,pcVar2,&hdr,iVar7);
      Imf_3_2::OutputFile::setFrameBuffer((FrameBuffer *)&local_228);
      Imf_3_2::Header::dataWindow();
      Imf_3_2::Header::dataWindow();
      Imf_3_2::OutputFile::writePixels((int)&local_228);
      pVVar12 = (Vec2<int> *)Imf_3_2::Header::dataWindow();
      local_1f8.min = *pVVar12;
      local_1f8.max = pVVar12[1];
      Imf_3_2::OutputFile::~OutputFile((OutputFile *)&local_228);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&readFrameBuf);
      Imf_3_2::Header::~Header(&hdr);
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
           &preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
      local_228._M_string_length._0_4_ = 0;
      local_228.field_2._M_allocated_capacity = 0;
      local_228.field_2._8_8_ = &local_228._M_string_length;
      local_200 = 0;
      preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           preReadFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
           readFrameBuf._map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      local_208 = (size_type *)local_228.field_2._8_8_;
      std::ostream::flush();
      pcVar2 = (anonymous_namespace)::filename_abi_cxx11_;
      iVar7 = Imf_3_2::globalThreadCount();
      Imf_3_2::InputFile::InputFile(&infile,pcVar2,iVar7);
      hdr_00 = (Header *)Imf_3_2::InputFile::header();
      setupBuffer((ChannelList *)&hdr,hdr_00,channels_00,passivechannels_00,pt_00,&readFrameBuf,
                  &preReadFrameBuf,(FrameBuffer *)&local_228,banks,false);
      nonfatal_00 = SUB81(passivechannels_00,0);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Channel>_>_>
                   *)&hdr);
      Imf_3_2::InputFile::setFrameBuffer((FrameBuffer *)&infile);
      std::ostream::flush();
      Imf_3_2::InputFile::header();
      lVar10 = Imf_3_2::Header::dataWindow();
      iVar7 = *(int *)(lVar10 + 4);
      Imf_3_2::InputFile::header();
      Imf_3_2::Header::dataWindow();
      Imf_3_2::InputFile::readPixels((int)&infile,iVar7);
      cVar4 = Imf_3_2::InputFile::isOptimizationEnabled();
      Imf_3_2::InputFile::~InputFile(&infile);
      compare(&readFrameBuf,&writeFrameBuf,&local_1f8,(bool)nonfatal_00);
      compare(&preReadFrameBuf,(FrameBuffer *)&local_228,&local_1f8,(bool)nonfatal_00);
      std::operator<<((ostream *)&std::cout," OK ");
      if (cVar4 != '\0') {
        std::operator<<((ostream *)&std::cout,"OPTIMISED ");
        (anonymous_namespace)::gOptimisedReads = (anonymous_namespace)::gOptimisedReads + 1;
      }
      std::operator<<((ostream *)&std::cout,"\n");
      (anonymous_namespace)::gSuccesses = (anonymous_namespace)::gSuccesses + 1;
      remove((anonymous_namespace)::filename_abi_cxx11_);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&local_228);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&preReadFrameBuf);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&readFrameBuf);
      std::
      _Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
      ::~_Rb_tree((_Rb_tree<Imf_3_2::Name,_std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>,_std::_Select1st<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>,_std::less<Imf_3_2::Name>,_std::allocator<std::pair<const_Imf_3_2::Name,_Imf_3_2::Slice>_>_>
                   *)&writeFrameBuf);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&q);
    }
  }
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0);
  poVar8 = std::operator<<(poVar8,'/');
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(anonymous_namespace)::gSuccesses);
  std::operator<<(poVar8," runs failed\n");
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,0);
  std::operator<<(poVar8," tests skipped (assumed to be bad)\n");
  poVar8 = (ostream *)std::ostream::operator<<(&std::cout,(anonymous_namespace)::gOptimisedReads);
  poVar8 = std::operator<<(poVar8,'/');
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,(anonymous_namespace)::gSuccesses);
  std::operator<<(poVar8," optimised\n");
  return;
}

Assistant:

void
runtests (bool nonfatal, bool tiny)
{
    random_reseed (1);
    int i       = 0;
    int skipped = 0;

    gFailures       = 0;
    gSuccesses      = 0;
    gOptimisedReads = 0;

    while (Schemes[i]._name != NULL)
    {
        int j = 0;
        while (Schemes[j]._name != NULL)
        {
            cout << right << setw (2) << i << ',' << right << setw (2) << j
                 << ": ";
            cout.flush ();

            if (nonfatal)
            {
                cout << " skipping " << Schemes[i]._name << ','
                     << Schemes[j]._name << ": known to crash\n";
                skipped++;
            }
            else
            {
                test (Schemes[i], Schemes[j], nonfatal, tiny);
            }
            j++;
        }
        i++;
    }

    cout << gFailures << '/' << (gSuccesses + gFailures) << " runs failed\n";
    cout << skipped << " tests skipped (assumed to be bad)\n";
    cout << gOptimisedReads << '/' << gSuccesses << " optimised\n";

    if (gFailures > 0)
    {
        cout << " TESTS FAILED\n";
        assert (false);
    }
}